

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGrid.cpp
# Opt level: O0

void __thiscall PatternGrid::mouseReleaseEvent(PatternGrid *this,QMouseEvent *evt)

{
  MouseButton MVar1;
  QMouseEvent *evt_local;
  PatternGrid *this_local;
  
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)evt);
  if (MVar1 == LeftButton) {
    if ((this->mMouseOp == beginSelecting) || (this->mMouseOp == dragging)) {
      PatternModel::deselect(this->mModel);
      PatternModel::setCursor
                (this->mModel,(PatternCursor)(this->mSelectionStart).super_PatternCursorBase);
    }
    this->mMouseOp = nothing;
  }
  return;
}

Assistant:

void PatternGrid::mouseReleaseEvent(QMouseEvent *evt) {

    if (evt->button() == Qt::LeftButton) {

        // if the user did not select anything, move the cursor to the starting coordinate
        if (mMouseOp == MouseOperation::beginSelecting || mMouseOp == MouseOperation::dragging) {
            mModel.deselect();
            mModel.setCursor(mSelectionStart);
        }

        mMouseOp = MouseOperation::nothing;
    }
}